

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::lower(QWidget *this)

{
  ulong uVar1;
  long *plVar2;
  QWidgetPrivate *this_00;
  long lVar3;
  long lVar4;
  QWExtra *pQVar5;
  bool bVar6;
  QWidgetPrivate *pQVar7;
  int iVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar7 = this_00;
  if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    lVar3 = *(long *)&this_00->field_0x10;
    lVar4 = *(long *)(lVar3 + 8);
    if ((int)*(long *)(lVar4 + 0x28) < 2) goto LAB_0030e2b8;
    uVar9 = 0xfffffffffffffff8;
    do {
      if (*(long *)(lVar4 + 0x28) * -8 + uVar9 == -8) {
        iVar8 = -1;
        goto LAB_0030e222;
      }
      uVar1 = uVar9 + 8;
      plVar2 = (long *)(*(long *)(lVar4 + 0x20) + 8 + uVar9);
      uVar9 = uVar1;
    } while ((QWidget *)*plVar2 != this);
    if ((int)(uVar1 >> 3) == 0) {
      bVar6 = true;
    }
    else {
      iVar8 = (int)((long)uVar1 >> 3);
LAB_0030e222:
      bVar6 = false;
      QList<QObject_*>::move((QList<QObject_*> *)(lVar4 + 0x18),(long)iVar8,0);
      pQVar7 = *(QWidgetPrivate **)&this->field_0x8;
    }
    if (((pQVar7->high_attributes[0] & 0x10000000) == 0) &&
       ((*(byte *)(*(long *)(lVar3 + 8) + 0x243) & 0x10) != 0)) {
      create(this,0,false,false);
      pQVar7 = *(QWidgetPrivate **)&this->field_0x8;
    }
    else if (bVar6) goto LAB_0030e2b8;
  }
  if ((pQVar7->high_attributes[0] & 0x10000000) != 0) {
    QWidgetPrivate::lower_sys(this_00);
  }
  pQVar5 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar5 != (QWExtra *)0x0) && ((pQVar5->field_0x7d & 1) != 0)) {
    QWindowContainer::parentWasLowered(this);
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_38,ZOrderChange);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_38);
  QEvent::~QEvent((QEvent *)&local_38);
LAB_0030e2b8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::lower()
{
    Q_D(QWidget);
    if (!isWindow()) {
        QWidget *p = parentWidget();
        const int parentChildCount = p->d_func()->children.size();
        if (parentChildCount < 2)
            return;
        const int from = p->d_func()->children.indexOf(this);
        Q_ASSERT(from >= 0);
        // Do nothing if the widget is already in correct stacking order _and_ created.
        if (from != 0)
            p->d_func()->children.move(from, 0);
        if (!testAttribute(Qt::WA_WState_Created) && p->testAttribute(Qt::WA_WState_Created))
            create();
        else if (from == 0)
            return;
    }
    if (testAttribute(Qt::WA_WState_Created))
        d->lower_sys();

    if (d->extra && d->extra->hasWindowContainer)
        QWindowContainer::parentWasLowered(this);

    QEvent e(QEvent::ZOrderChange);
    QCoreApplication::sendEvent(this, &e);
}